

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

bool __thiscall Mesh::loadObj(Mesh *this,string *filePath)

{
  char *pcVar1;
  allocator local_51;
  string local_50 [36];
  MeshData local_2c;
  bool local_19;
  string *psStack_18;
  bool succes;
  string *filePath_local;
  Mesh *this_local;
  
  local_19 = false;
  psStack_18 = filePath;
  filePath_local = (string *)this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,&local_51);
  local_2c = ObjLoader::loadOBJ((string *)local_50,&local_19);
  this->meshData = local_2c;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return (bool)(local_19 & 1);
}

Assistant:

bool Mesh::loadObj(std::string filePath)
{
	bool succes = false;
	meshData = ObjLoader::loadOBJ(filePath.c_str(), succes);
	return succes;

}